

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaLiteTest_Parsing_Test::Proto3ArenaLiteTest_Parsing_Test
          (Proto3ArenaLiteTest_Parsing_Test *this)

{
  Proto3ArenaLiteTest_Parsing_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Proto3ArenaLiteTest_Parsing_Test_029e2d00;
  return;
}

Assistant:

TEST(Proto3ArenaLiteTest, Parsing) {
  TestAllTypes original;
  SetAllFields(&original);

  Arena arena;
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
  arena_message->ParseFromString(original.SerializeAsString());
  ExpectAllFieldsSet(*arena_message);
}